

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

QString * __thiscall QTextDocumentPrivate::plainText(QTextDocumentPrivate *this)

{
  bool bVar1;
  QChar *pQVar2;
  QTextFragmentData *pQVar3;
  ConstIterator *in_RDI;
  long in_FS_OFFSET;
  QTextFragmentData *f;
  QChar *data;
  QChar *text_unicode;
  QString *result;
  FragmentIterator it;
  QTextDocumentPrivate *in_stack_ffffffffffffff88;
  ConstIterator *this_00;
  QChar *local_50;
  ConstIterator local_28;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->pt)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->n = &DAT_aaaaaaaaaaaaaaaa;
  in_RDI[1].pt = (QFragmentMap<QTextFragmentData> *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QString::QString((QString *)0x7d6311);
  length((QTextDocumentPrivate *)0x7d631b);
  QString::resize((longlong)in_RDI);
  pQVar2 = QString::unicode((QString *)0x7d6339);
  local_50 = QString::data((QString *)this_00);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  begin(in_stack_ffffffffffffff88);
  while( true ) {
    end(in_stack_ffffffffffffff88);
    bVar1 = QFragmentMap<QTextFragmentData>::ConstIterator::operator!=
                      ((ConstIterator *)local_18,&local_28);
    if (!bVar1) break;
    pQVar3 = QFragmentMap<QTextFragmentData>::ConstIterator::operator*((ConstIterator *)0x7d63a2);
    memcpy(local_50,pQVar2 + pQVar3->stringPosition,
           (ulong)(pQVar3->super_QFragment<1>).size_array[0] << 1);
    local_50 = local_50 + (pQVar3->super_QFragment<1>).size_array[0];
    QFragmentMap<QTextFragmentData>::ConstIterator::operator++(this_00);
  }
  QString::chop((longlong)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)this_00;
}

Assistant:

QString QTextDocumentPrivate::plainText() const
{
    QString result;
    result.resize(length());
    const QChar *text_unicode = text.unicode();
    QChar *data = result.data();
    for (QTextDocumentPrivate::FragmentIterator it = begin(); it != end(); ++it) {
        const QTextFragmentData *f = *it;
        ::memcpy(data, text_unicode + f->stringPosition, f->size_array[0] * sizeof(QChar));
        data += f->size_array[0];
    }
    // remove trailing block separator
    result.chop(1);
    return result;
}